

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O2

void duckdb::TupleDataListGather
               (TupleDataLayout *layout,Vector *row_locations,idx_t col_idx,
               SelectionVector *scan_sel,idx_t scan_count,Vector *target,SelectionVector *target_sel
               ,optional_ptr<duckdb::Vector,_true> param_8,
               vector<duckdb::TupleDataGatherFunction,_true> *child_functions)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  value_type vVar3;
  long *plVar4;
  long lVar5;
  tuple_data_gather_function_t p_Var6;
  const_reference pvVar7;
  idx_t iVar8;
  ulong uVar9;
  const_reference pvVar10;
  Vector *pVVar11;
  ulong uVar12;
  idx_t required_capacity;
  ValidityBytes row_mask;
  LogicalType local_b0;
  Vector heap_locations;
  
  pdVar1 = row_locations->data;
  pdVar2 = target->data;
  FlatVector::VerifyFlatVector(target);
  LogicalType::LogicalType(&local_b0,POINTER);
  Vector::Vector(&heap_locations,&local_b0,0x800);
  LogicalType::~LogicalType(&local_b0);
  pvVar7 = vector<unsigned_long,_true>::get<true>(&layout->offsets,col_idx);
  vVar3 = *pvVar7;
  iVar8 = ListVector::GetListSize(target);
  required_capacity = iVar8;
  for (uVar12 = 0; scan_count != uVar12; uVar12 = uVar12 + 1) {
    uVar9 = uVar12;
    if (scan_sel->sel_vector != (sel_t *)0x0) {
      uVar9 = (ulong)scan_sel->sel_vector[uVar12];
    }
    row_mask.validity_mask = *(uchar **)(pdVar1 + uVar9 * 8);
    row_mask.capacity =
         ((long)(layout->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_finish -
         (long)(layout->types).
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start) / 0x18;
    row_mask.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    row_mask.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    uVar9 = uVar12;
    if (target_sel->sel_vector != (sel_t *)0x0) {
      uVar9 = (ulong)target_sel->sel_vector[uVar12];
    }
    if ((1 << ((byte)col_idx & 7) & (uint)row_mask.validity_mask[col_idx >> 3]) == 0) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(target->validity).super_TemplatedValidityMask<unsigned_long>,uVar9);
    }
    else {
      plVar4 = *(long **)(row_mask.validity_mask + vVar3);
      *(long **)(heap_locations.data + uVar12 * 8) = plVar4;
      lVar5 = *plVar4;
      *(long **)(heap_locations.data + uVar12 * 8) = plVar4 + 1;
      *(idx_t *)(pdVar2 + uVar9 * 0x10) = required_capacity;
      *(long *)(pdVar2 + uVar9 * 0x10 + 8) = lVar5;
      required_capacity = required_capacity + lVar5;
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&row_mask.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  ListVector::Reserve(target,required_capacity);
  ListVector::SetListSize(target,required_capacity);
  pvVar10 = vector<duckdb::TupleDataGatherFunction,_true>::get<true>(child_functions,0);
  p_Var6 = pvVar10->function;
  pVVar11 = ListVector::GetEntry(target);
  (*p_Var6)(layout,&heap_locations,iVar8,scan_sel,scan_count,pVVar11,target_sel,
            (optional_ptr<duckdb::Vector,_true>)target,&pvVar10->child_functions);
  Vector::~Vector(&heap_locations);
  return;
}

Assistant:

static void TupleDataListGather(const TupleDataLayout &layout, Vector &row_locations, const idx_t col_idx,
                                const SelectionVector &scan_sel, const idx_t scan_count, Vector &target,
                                const SelectionVector &target_sel, optional_ptr<Vector>,
                                const vector<TupleDataGatherFunction> &child_functions) {
	// Source
	const auto source_locations = FlatVector::GetData<data_ptr_t>(row_locations);

	// Target
	const auto target_list_entries = FlatVector::GetData<list_entry_t>(target);
	auto &target_list_validity = FlatVector::Validity(target);

	// Precompute mask indexes
	idx_t entry_idx;
	idx_t idx_in_entry;
	ValidityBytes::GetEntryIndex(col_idx, entry_idx, idx_in_entry);

	// Load pointers to the data from the row
	Vector heap_locations(LogicalType::POINTER);
	const auto source_heap_locations = FlatVector::GetData<data_ptr_t>(heap_locations);

	const auto offset_in_row = layout.GetOffsets()[col_idx];
	auto list_size_before = ListVector::GetListSize(target);
	uint64_t target_list_offset = list_size_before;
	for (idx_t i = 0; i < scan_count; i++) {
		const auto &source_row = source_locations[scan_sel.get_index(i)];
		ValidityBytes row_mask(source_row, layout.ColumnCount());

		const auto target_idx = target_sel.get_index(i);
		if (row_mask.RowIsValid(row_mask.GetValidityEntryUnsafe(entry_idx), idx_in_entry)) {
			auto &source_heap_location = source_heap_locations[i];
			source_heap_location = Load<data_ptr_t>(source_row + offset_in_row);

			// Load list size and skip over
			const auto list_length = Load<uint64_t>(source_heap_location);
			source_heap_location += sizeof(uint64_t);

			// Initialize list entry, and increment offset
			auto &target_list_entry = target_list_entries[target_idx];
			target_list_entry.offset = target_list_offset;
			target_list_entry.length = list_length;
			target_list_offset += list_length;
		} else {
			target_list_validity.SetInvalid(target_idx);
		}
	}
	ListVector::Reserve(target, target_list_offset);
	ListVector::SetListSize(target, target_list_offset);

	// Recurse
	D_ASSERT(child_functions.size() == 1);
	const auto &child_function = child_functions[0];
	child_function.function(layout, heap_locations, list_size_before, scan_sel, scan_count,
	                        ListVector::GetEntry(target), target_sel, &target, child_function.child_functions);
}